

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::cose::CoseTest_CoseSignAndVerify_SignWithExternalData_Test::
~CoseTest_CoseSignAndVerify_SignWithExternalData_Test
          (CoseTest_CoseSignAndVerify_SignWithExternalData_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoseTest, CoseSignAndVerify_SignWithExternalData)
{
    ByteArray content{1, 2, 3, 4, 5, 6};
    ByteArray externalData{6, 5, 4, 3, 2, 1};

    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);

    EXPECT_EQ(ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)}),
              ErrorCode::kNone);
    EXPECT_EQ(ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)}), ErrorCode::kNone);

    ByteArray    signature;
    Sign1Message msg;

    EXPECT_EQ(msg.Init(kInitFlagsNone), ErrorCode::kNone);
    EXPECT_EQ(msg.AddAttribute(kHeaderAlgorithm, kAlgEcdsaWithSha256, kProtectOnly), ErrorCode::kNone);
    EXPECT_EQ(msg.SetContent({}), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Sign(privateKey), ErrorCode::kNone);

    EXPECT_EQ(msg.Serialize(signature), ErrorCode::kNone);
    msg.Free();

    EXPECT_EQ(Sign1Message::Deserialize(msg, signature), ErrorCode::kNone);
    EXPECT_EQ(msg.SetExternalData(externalData), ErrorCode::kNone);
    EXPECT_EQ(msg.Validate(publicKey), ErrorCode::kNone);
}